

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSceneLoader.cpp
# Opt level: O0

void __thiscall COLLADASaxFWL::SceneLoader::~SceneLoader(SceneLoader *this)

{
  SceneLoader *in_RDI;
  
  ~SceneLoader(in_RDI);
  operator_delete(in_RDI,0x90);
  return;
}

Assistant:

SceneLoader::~SceneLoader ()
	{
	}